

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O3

char * stumpless_get_target_default_msgid(stumpless_target *target)

{
  char *__dest;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    __dest = (char *)0x0;
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)target->mutex);
    __dest = (char *)alloc_mem(target->default_msgid_length + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,target->default_msgid,target->default_msgid_length);
      __dest[target->default_msgid_length] = '\0';
      clear_error();
    }
    pthread_unlock_mutex((pthread_mutex_t *)target->mutex);
  }
  return __dest;
}

Assistant:

const char *
stumpless_get_target_default_msgid( const struct stumpless_target *target ) {
  char *msgid_copy = NULL;

  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );

  msgid_copy = alloc_mem( target->default_msgid_length + 1 );
  if( !msgid_copy ) {
    goto cleanup_and_return;
  }

  memcpy( msgid_copy, target->default_msgid, target->default_msgid_length );
  msgid_copy[target->default_msgid_length] = '\0';
  clear_error(  );

cleanup_and_return:
  unlock_target( target );
  return msgid_copy;
}